

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPML_ALG_Unmarshal(TPML_ALG *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPML_ALG *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(&target->count,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->count < 0x41) {
      target_local._4_4_ = TPM_ALG_ID_Array_Unmarshal(target->algorithms,buffer,size,target->count);
    }
    else {
      target_local._4_4_ = 0x95;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPML_ALG_Unmarshal(TPML_ALG *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_ALG_LIST_SIZE)
        return TPM_RC_SIZE;
    result = TPM_ALG_ID_Array_Unmarshal((TPM_ALG_ID *)(target->algorithms), buffer, size, (INT32)(target->count));
    return result;
}